

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O1

int __thiscall OpenMD::IndexListContainer::pop(IndexListContainer *this)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  if ((this->indexContainer_).
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&this->indexContainer_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  p_Var4 = (this->indexContainer_).
           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  iVar3 = *(int *)&p_Var4[1]._M_next;
  iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
  if (iVar3 == iVar2) {
    psVar1 = &(this->indexContainer_).
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4,0x18);
  }
  else if (iVar3 < iVar2) {
    *(int *)&p_Var4[1]._M_next = iVar3 + 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  return iVar3;
}

Assistant:

int pop() {
      if (indexContainer_.empty()) { std::cerr << "" << std::endl; }

      int result;

      result = indexContainer_.front().first;

      if (indexContainer_.front().first == indexContainer_.front().second) {
        indexContainer_.pop_front();
      } else if (indexContainer_.front().first <
                 indexContainer_.front().second) {
        ++indexContainer_.front().first;
      } else {
        std::cerr << "" << std::endl;
      }

      return result;
    }